

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e-hierarchy-decoder-CH.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  uint uVar4;
  ostream *poVar5;
  istream *piVar6;
  void *this;
  size_type sVar7;
  size_type sVar8;
  ulong uVar9;
  reference pvVar10;
  string *psVar11;
  undefined8 *in_RSI;
  int in_EDI;
  real rVar12;
  double dVar13;
  double dVar14;
  undefined8 extraout_XMM1_Qa;
  undefined1 extraout_var [56];
  double F;
  double R;
  double P;
  int j;
  int i;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  results;
  ComputationGraph cg;
  Instance *sent;
  iterator __end1;
  iterator __begin1;
  vector<Instance,_std::allocator<Instance>_> *__range1;
  double dcorr;
  uint doverall;
  uint dpredict;
  double dloss;
  ofstream out;
  text_iarchive ia;
  ifstream in;
  bool in_stack_00000603;
  uint in_stack_00000604;
  char ***in_stack_00000608;
  int *in_stack_00000610;
  undefined1 in_stack_00000637;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *in_stack_00000638;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *in_stack_00000640;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *in_stack_00000648;
  vector<int,_std::allocator<int>_> *in_stack_00000650;
  RNNLanguageModel<cnn::FastLSTMBuilder> *in_stack_00000658;
  ComputationGraph *in_stack_00000670;
  double *in_stack_00000678;
  uint *in_stack_00000680;
  uint *in_stack_00000688;
  string fname;
  RNNLanguageModel<cnn::FastLSTMBuilder> lm;
  Model model;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  c_1;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  y_1;
  vector<int,_std::allocator<int>_> x_1;
  ifstream in_2;
  int unk_1;
  int total_1;
  int dtoks;
  int dlc;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  c;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  y;
  vector<int,_std::allocator<int>_> x;
  ifstream in_1;
  int unk;
  int total;
  int ttoks;
  int tlc;
  string line;
  vector<Instance,_std::allocator<Instance>_> dev;
  vector<Instance,_std::allocator<Instance>_> training;
  Dict *in_stack_ffffffffffffee58;
  RNNLanguageModel<cnn::FastLSTMBuilder> *in_stack_ffffffffffffee60;
  int *id;
  Dict *in_stack_ffffffffffffee70;
  undefined4 in_stack_ffffffffffffee78;
  undefined4 in_stack_ffffffffffffee7c;
  Dict *in_stack_ffffffffffffee80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffee88;
  ComputationGraph *in_stack_ffffffffffffee90;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *in_stack_ffffffffffffee98;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *in_stack_ffffffffffffeea0;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffeea8;
  Instance *in_stack_ffffffffffffeeb0;
  string *in_stack_ffffffffffffeec0;
  Dict *in_stack_ffffffffffffeec8;
  int local_f88;
  int local_f84;
  pointer in_stack_fffffffffffff098;
  Dict *in_stack_fffffffffffff0a0;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *in_stack_fffffffffffff0a8;
  Dict *in_stack_fffffffffffff0b0;
  pointer in_stack_fffffffffffff0b8;
  string *in_stack_fffffffffffff0c0;
  Dict *in_stack_fffffffffffff0d0;
  __node_base in_stack_fffffffffffff0d8;
  int *in_stack_fffffffffffff0e0;
  __normal_iterator<Instance_*,_std::vector<Instance,_std::allocator<Instance>_>_> local_f10;
  __node_base *local_f08;
  undefined1 local_f00 [12];
  int local_ef4;
  Parameters *local_ef0;
  string local_ee8 [32];
  ostream local_ec8 [640];
  undefined1 local_c48 [352];
  Model *in_stack_fffffffffffff518;
  RNNLanguageModel<cnn::FastLSTMBuilder> *in_stack_fffffffffffff520;
  allocator local_a39;
  string local_a38 [1032];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_630;
  vector<int,_std::allocator<int>_> local_618;
  long local_600 [65];
  undefined1 local_3f4 [20];
  string local_3e0 [39];
  allocator local_3b9;
  string local_3b8 [39];
  allocator local_391;
  string local_390 [39];
  allocator local_369;
  string local_368 [152];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_2d0;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_2b8;
  vector<int,_std::allocator<int>_> local_2a0;
  long local_288 [65];
  undefined1 local_7c [60];
  __node_base local_40 [6];
  undefined8 *local_10;
  int local_8;
  int local_4;
  undefined1 auVar15 [64];
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  cnn::Initialize(in_stack_00000610,in_stack_00000608,in_stack_00000604,in_stack_00000603);
  if (local_8 == 4) {
    std::vector<Instance,_std::allocator<Instance>_>::vector
              ((vector<Instance,_std::allocator<Instance>_> *)0x327ce9);
    std::vector<Instance,_std::allocator<Instance>_>::vector
              ((vector<Instance,_std::allocator<Instance>_> *)0x327cf6);
    std::__cxx11::string::string((string *)(local_7c + 0x1c));
    local_7c._24_4_ = 0;
    local_7c._20_4_ = 0;
    poVar5 = std::operator<<((ostream *)&std::cerr,"Reading training data from ");
    poVar5 = std::operator<<(poVar5,(char *)local_10[1]);
    std::operator<<(poVar5,"...\n");
    local_7c._4_4_ = 0;
    local_7c._0_4_ = 0;
    std::ifstream::ifstream(local_288,local_10[1],8);
    bVar3 = std::ios::operator_cast_to_bool
                      ((ios *)((long)local_288 + *(long *)(local_288[0] + -0x18)));
    if (!bVar3) {
      __assert_fail("in",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/impl/e-hierarchy-decoder-CH.cc"
                    ,0x1de,"int main(int, char **)");
    }
    while( true ) {
      piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_288,(string *)(local_7c + 0x1c));
      bVar3 = std::ios::operator_cast_to_bool((ios *)(piVar6 + *(long *)(*(long *)piVar6 + -0x18)));
      if (!bVar3) break;
      local_7c._24_4_ = local_7c._24_4_ + 1;
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x327e9d);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)0x327eb2);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)0x327ec7);
      in_stack_ffffffffffffee60 = (RNNLanguageModel<cnn::FastLSTMBuilder> *)local_7c;
      in_stack_ffffffffffffee58 = &ld;
      ReadSentencePair(in_stack_fffffffffffff0c0,
                       (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff0b8,
                       in_stack_fffffffffffff0b0,in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0
                       ,(vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         *)in_stack_fffffffffffff098,in_stack_fffffffffffff0d0,
                       (int *)in_stack_fffffffffffff0d8._M_nxt,in_stack_fffffffffffff0e0);
      sVar8 = std::vector<int,_std::allocator<int>_>::size(&local_2a0);
      sVar7 = std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::size(&local_2b8);
      bVar3 = false;
      if (sVar8 == sVar7) {
        sVar8 = std::vector<int,_std::allocator<int>_>::size(&local_2a0);
        sVar7 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::size(&local_2d0);
        bVar3 = sVar8 == sVar7;
      }
      if (!bVar3) {
        __assert_fail("x.size() == y.size() && x.size() == c.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/impl/e-hierarchy-decoder-CH.cc"
                      ,0x1e5,"int main(int, char **)");
      }
      sVar8 = std::vector<int,_std::allocator<int>_>::size(&local_2a0);
      if (sVar8 == 0) {
        poVar5 = std::operator<<((ostream *)&std::cerr,(string *)(local_7c + 0x1c));
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        abort();
      }
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)in_stack_ffffffffffffeeb0,
               (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)in_stack_ffffffffffffeea8);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)in_stack_ffffffffffffeeb0,
               (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)in_stack_ffffffffffffeea8);
      Instance::Instance(in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeea8,
                         in_stack_ffffffffffffeea0,in_stack_ffffffffffffee98);
      std::vector<Instance,_std::allocator<Instance>_>::push_back
                ((vector<Instance,_std::allocator<Instance>_> *)in_stack_ffffffffffffee60,
                 (value_type *)in_stack_ffffffffffffee58);
      Instance::~Instance((Instance *)in_stack_ffffffffffffee60);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)in_stack_ffffffffffffee70);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)in_stack_ffffffffffffee70);
      sVar8 = std::vector<int,_std::allocator<int>_>::size(&local_2a0);
      local_7c._20_4_ = local_7c._20_4_ + (int)sVar8;
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)in_stack_ffffffffffffee70);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)in_stack_ffffffffffffee70);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffee70);
    }
    poVar5 = (ostream *)std::ostream::operator<<(&std::cerr,local_7c._24_4_);
    poVar5 = std::operator<<(poVar5," lines, ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_7c._20_4_);
    poVar5 = std::operator<<(poVar5," tokens, ");
    uVar4 = cnn::Dict::size((Dict *)0x328220);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar4);
    std::operator<<(poVar5," types\n");
    poVar5 = std::operator<<((ostream *)&std::cerr,"OOV ratio: ");
    poVar5 = (ostream *)
             std::ostream::operator<<
                       (poVar5,(float)(int)local_7c._0_4_ / (float)(int)local_7c._4_4_);
    std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<((ostream *)&std::cerr,"Tags: ");
    uVar4 = cnn::Dict::size((Dict *)0x3282e6);
    this = (void *)std::ostream::operator<<(poVar5,uVar4);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    std::ifstream::~ifstream(local_288);
    cnn::Dict::Freeze(&wd);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_368,"*UNK*",&local_369);
    cnn::Dict::SetUnk(in_stack_ffffffffffffee80,
                      (string *)CONCAT44(in_stack_ffffffffffffee7c,in_stack_ffffffffffffee78));
    std::__cxx11::string::~string(local_368);
    std::allocator<char>::~allocator((allocator<char> *)&local_369);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_390,"NULL",&local_391);
    endlabel = cnn::Dict::Convert(in_stack_ffffffffffffeec8,in_stack_ffffffffffffeec0);
    std::__cxx11::string::~string(local_390);
    std::allocator<char>::~allocator((allocator<char> *)&local_391);
    cnn::Dict::Freeze(&cd);
    cnn::Dict::Freeze(&ld);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3b8,"*UNK*",&local_3b9);
    cnn::Dict::SetUnk(in_stack_ffffffffffffee80,
                      (string *)CONCAT44(in_stack_ffffffffffffee7c,in_stack_ffffffffffffee78));
    std::__cxx11::string::~string(local_3b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3e0,"*UNK*",(allocator *)(local_3f4 + 0x13));
    cnn::Dict::SetUnk(in_stack_ffffffffffffee80,
                      (string *)CONCAT44(in_stack_ffffffffffffee7c,in_stack_ffffffffffffee78));
    std::__cxx11::string::~string(local_3e0);
    std::allocator<char>::~allocator((allocator<char> *)(local_3f4 + 0x13));
    VOCAB_SIZE = cnn::Dict::size((Dict *)0x328509);
    CHAR_SIZE = cnn::Dict::size((Dict *)0x32852e);
    LABEL_SIZE = cnn::Dict::size((Dict *)0x328553);
    local_3f4._12_4_ = 0;
    local_3f4._8_4_ = 0;
    poVar5 = std::operator<<((ostream *)&std::cerr,"Reading dev data from ");
    poVar5 = std::operator<<(poVar5,(char *)local_10[2]);
    std::operator<<(poVar5,"...\n");
    local_3f4._4_4_ = 0;
    local_3f4._0_4_ = 0;
    std::ifstream::ifstream(local_600,local_10[2],8);
    bVar3 = std::ios::operator_cast_to_bool
                      ((ios *)((long)local_600 + *(long *)(local_600[0] + -0x18)));
    if (!bVar3) {
      __assert_fail("in",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/impl/e-hierarchy-decoder-CH.cc"
                    ,0x201,"int main(int, char **)");
    }
    while( true ) {
      piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_600,(string *)(local_7c + 0x1c));
      bVar3 = std::ios::operator_cast_to_bool((ios *)(piVar6 + *(long *)(*(long *)piVar6 + -0x18)));
      if (!bVar3) break;
      local_3f4._12_4_ = local_3f4._12_4_ + 1;
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x328826);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)0x32883b);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)0x328850);
      in_stack_ffffffffffffee60 = (RNNLanguageModel<cnn::FastLSTMBuilder> *)local_3f4;
      in_stack_ffffffffffffee58 = &ld;
      ReadSentencePair(in_stack_fffffffffffff0c0,
                       (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff0b8,
                       in_stack_fffffffffffff0b0,in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0
                       ,(vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         *)in_stack_fffffffffffff098,in_stack_fffffffffffff0d0,
                       (int *)in_stack_fffffffffffff0d8._M_nxt,in_stack_fffffffffffff0e0);
      sVar8 = std::vector<int,_std::allocator<int>_>::size(&local_618);
      sVar7 = std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::size(&local_630);
      if (sVar8 != sVar7) {
        __assert_fail("x.size() == y.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/impl/e-hierarchy-decoder-CH.cc"
                      ,0x208,"int main(int, char **)");
      }
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)in_stack_ffffffffffffeeb0,
               (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)in_stack_ffffffffffffeea8);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)in_stack_ffffffffffffeeb0,
               (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)in_stack_ffffffffffffeea8);
      Instance::Instance(in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeea8,
                         in_stack_ffffffffffffeea0,in_stack_ffffffffffffee98);
      std::vector<Instance,_std::allocator<Instance>_>::push_back
                ((vector<Instance,_std::allocator<Instance>_> *)in_stack_ffffffffffffee60,
                 (value_type *)in_stack_ffffffffffffee58);
      Instance::~Instance((Instance *)in_stack_ffffffffffffee60);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)in_stack_ffffffffffffee70);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)in_stack_ffffffffffffee70);
      sVar8 = std::vector<int,_std::allocator<int>_>::size(&local_618);
      local_3f4._8_4_ = local_3f4._8_4_ + (int)sVar8;
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)in_stack_ffffffffffffee70);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)in_stack_ffffffffffffee70);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffee70);
    }
    poVar5 = (ostream *)std::ostream::operator<<(&std::cerr,local_3f4._12_4_);
    poVar5 = std::operator<<(poVar5," lines, ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_3f4._8_4_);
    std::operator<<(poVar5," tokens\n");
    poVar5 = std::operator<<((ostream *)&std::cerr,"OOV ratio: ");
    poVar5 = (ostream *)
             std::ostream::operator<<
                       (poVar5,(float)(int)local_3f4._0_4_ / (float)(int)local_3f4._4_4_);
    std::operator<<(poVar5,"\n");
    std::ifstream::~ifstream(local_600);
    cnn::Model::Model((Model *)in_stack_ffffffffffffee60);
    RNNLanguageModel<cnn::FastLSTMBuilder>::RNNLanguageModel
              (in_stack_fffffffffffff520,in_stack_fffffffffffff518);
    pcVar1 = (char *)local_10[3];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a38,pcVar1,&local_a39);
    std::allocator<char>::~allocator((allocator<char> *)&local_a39);
    std::ifstream::ifstream(local_c48,local_a38,8);
    boost::archive::text_iarchive::text_iarchive
              ((text_iarchive *)in_stack_ffffffffffffee80,
               (istream *)CONCAT44(in_stack_ffffffffffffee7c,in_stack_ffffffffffffee78),
               (uint)((ulong)in_stack_ffffffffffffee70 >> 0x20));
    boost::archive::detail::interface_iarchive<boost::archive::text_iarchive>::operator>>
              ((interface_iarchive<boost::archive::text_iarchive> *)in_stack_ffffffffffffee60,
               (Model *)in_stack_ffffffffffffee58);
    std::__cxx11::string::operator=(local_a38,(char *)local_10[2]);
    std::operator+(in_stack_ffffffffffffee88,&in_stack_ffffffffffffee80->frozen);
    std::ofstream::ofstream(local_ec8,local_ee8,0x10);
    std::__cxx11::string::~string(local_ee8);
    local_ef0 = (Parameters *)0x0;
    local_ef4 = 0;
    local_f00._8_4_ = 0;
    local_f00._0_8_ = (LookupParameters *)0x0;
    eval = true;
    local_f08 = local_40;
    local_f10._M_current =
         (Instance *)
         std::vector<Instance,_std::allocator<Instance>_>::begin
                   ((vector<Instance,_std::allocator<Instance>_> *)in_stack_ffffffffffffee58);
    std::vector<Instance,_std::allocator<Instance>_>::end
              ((vector<Instance,_std::allocator<Instance>_> *)in_stack_ffffffffffffee58);
    while (bVar3 = __gnu_cxx::operator!=
                             ((__normal_iterator<Instance_*,_std::vector<Instance,_std::allocator<Instance>_>_>
                               *)in_stack_ffffffffffffee60,
                              (__normal_iterator<Instance_*,_std::vector<Instance,_std::allocator<Instance>_>_>
                               *)in_stack_ffffffffffffee58), bVar3) {
      __gnu_cxx::__normal_iterator<Instance_*,_std::vector<Instance,_std::allocator<Instance>_>_>::
      operator*(&local_f10);
      cnn::ComputationGraph::ComputationGraph(in_stack_ffffffffffffee90);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)0x328d5a);
      in_stack_ffffffffffffee70 = (Dict *)(local_f00 + 8);
      id = &local_ef4;
      in_stack_ffffffffffffee60 = (RNNLanguageModel<cnn::FastLSTMBuilder> *)local_f00;
      in_stack_ffffffffffffee58 = (Dict *)&stack0xfffffffffffff0a8;
      RNNLanguageModel<cnn::FastLSTMBuilder>::BuildTaggingGraph
                (in_stack_00000658,in_stack_00000650,in_stack_00000648,in_stack_00000640,
                 in_stack_00000638,in_stack_00000670,in_stack_00000678,in_stack_00000680,
                 in_stack_00000688,(bool)in_stack_00000637);
      cnn::ComputationGraph::forward((ComputationGraph *)0x328dd5);
      rVar12 = cnn::as_scalar((Tensor *)0x328dec);
      local_ef0 = (Parameters *)((double)rVar12 + (double)local_ef0);
      for (local_f84 = 0;
          sVar8 = std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::size((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          *)&stack0xfffffffffffff090), (ulong)(long)local_f84 < sVar8;
          local_f84 = local_f84 + 1) {
        local_f88 = 0;
        while( true ) {
          uVar9 = (ulong)local_f88;
          pvVar10 = std::
                    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  *)&stack0xfffffffffffff090,(long)local_f84);
          sVar8 = std::vector<int,_std::allocator<int>_>::size(pvVar10);
          if (sVar8 <= uVar9) break;
          pvVar10 = std::
                    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  *)&stack0xfffffffffffff090,(long)local_f84);
          std::vector<int,_std::allocator<int>_>::operator[](pvVar10,(long)local_f88);
          psVar11 = cnn::Dict::Convert_abi_cxx11_(in_stack_ffffffffffffee70,id);
          poVar5 = std::operator<<(local_ec8,(string *)psVar11);
          std::operator<<(poVar5," ");
          local_f88 = local_f88 + 1;
        }
        std::operator<<(local_ec8,"||| ");
      }
      std::operator<<(local_ec8,"\n");
      std::ostream::flush();
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)in_stack_ffffffffffffee70);
      cnn::ComputationGraph::~ComputationGraph((ComputationGraph *)in_stack_ffffffffffffee60);
      __gnu_cxx::__normal_iterator<Instance_*,_std::vector<Instance,_std::allocator<Instance>_>_>::
      operator++(&local_f10);
    }
    std::ofstream::close();
    auVar15._8_56_ = extraout_var;
    auVar15._0_8_ = extraout_XMM1_Qa;
    eval = false;
    auVar2 = vcvtusi2sd_avx512f(auVar15._0_16_,local_ef4);
    dVar13 = (double)local_f00._0_8_ / auVar2._0_8_;
    auVar2 = vcvtusi2sd_avx512f(auVar2,local_f00._8_4_);
    dVar14 = (double)local_f00._0_8_ / auVar2._0_8_;
    poVar5 = std::operator<<((ostream *)&std::cerr,"\n***DEV P = ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar13);
    poVar5 = std::operator<<(poVar5," R = ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar14);
    poVar5 = std::operator<<(poVar5," F=");
    poVar5 = (ostream *)
             std::ostream::operator<<(poVar5,(dVar13 * (dVar14 + dVar14)) / (dVar13 + dVar14));
    std::operator<<(poVar5,' ');
    std::ofstream::~ofstream(local_ec8);
    boost::archive::text_iarchive::~text_iarchive((text_iarchive *)0x3291e7);
    std::ifstream::~ifstream(local_c48);
    std::__cxx11::string::~string(local_a38);
    RNNLanguageModel<cnn::FastLSTMBuilder>::~RNNLanguageModel(in_stack_ffffffffffffee60);
    cnn::Model::~Model((Model *)in_stack_ffffffffffffee80);
    std::__cxx11::string::~string((string *)(local_7c + 0x1c));
    std::vector<Instance,_std::allocator<Instance>_>::~vector
              ((vector<Instance,_std::allocator<Instance>_> *)in_stack_ffffffffffffee70);
    std::vector<Instance,_std::allocator<Instance>_>::~vector
              ((vector<Instance,_std::allocator<Instance>_> *)in_stack_ffffffffffffee70);
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Usage: ");
    poVar5 = std::operator<<(poVar5,(char *)*local_10);
    std::operator<<(poVar5," corpus.txt dev.txt [model.params]\n");
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int argc, char** argv) {
  cnn::Initialize(argc, argv, 1989);
  if (argc != 4) {
    cerr << "Usage: " << argv[0] << " corpus.txt dev.txt [model.params]\n";
    return 1;
  }
  vector<Instance> training,dev;
  string line;

  int tlc = 0;
  int ttoks = 0;
  
  cerr << "Reading training data from " << argv[1] << "...\n";
  {
    int total = 0;
    int unk = 0;
    ifstream in(argv[1]);
    assert(in);
    while(getline(in, line)) {
      ++tlc;
      vector<int> x;
      vector< vector<int> > y;
      vector< vector<int> > c;
      ReadSentencePair(line, &x, &wd, c, &cd, y, &ld, unk, total);
      assert(x.size() == y.size() && x.size() == c.size());
      if (x.size() == 0) { cerr << line << endl; abort(); }
      training.push_back(Instance(x,c,y));
      ttoks += x.size();
    }
    cerr << tlc << " lines, " << ttoks << " tokens, " << wd.size() << " types\n";
    cerr << "OOV ratio: " << float(unk)/total<<"\n";
    cerr << "Tags: " << ld.size() << endl;
  }
  wd.Freeze();
  wd.SetUnk("*UNK*");
  endlabel = ld.Convert("NULL");
  cd.Freeze();
  ld.Freeze(); // no new tag types allowed

  cd.SetUnk("*UNK*");
  ld.SetUnk("*UNK*");  
  VOCAB_SIZE = wd.size();
  CHAR_SIZE = cd.size();
  LABEL_SIZE = ld.size();

  int dlc = 0;
  int dtoks = 0;
  cerr << "Reading dev data from " << argv[2] << "...\n";
  {
    int total = 0;
    int unk = 0;
    ifstream in(argv[2]);
    assert(in);
    while(getline(in, line)) {
      ++dlc;
      vector<int> x;
      vector< vector<int> > y;
      vector< vector<int> > c;
      ReadSentencePair(line, &x, &wd, c, &cd, y, &ld, unk, total);
      assert(x.size() == y.size());
      dev.push_back(Instance(x,c,y));
      dtoks += x.size();
    }
    cerr << dlc << " lines, " << dtoks << " tokens\n";
    cerr << "OOV ratio: " << float(unk)/total<<"\n";
  }
  Model model;

  RNNLanguageModel<FastLSTMBuilder> lm(model);
  //RNNLanguageModel<SimpleRNNBuilder> lm(model);
    string fname = argv[3];
    ifstream in(fname);
    boost::archive::text_iarchive ia(in);
    ia >> model;

	fname = argv[2];
  ofstream out(fname+"OUT");
      double dloss = 0;
      unsigned dpredict = 0;
      unsigned doverall = 0;
      double dcorr = 0;
	eval = true;
      for (auto& sent : dev) {
        ComputationGraph cg;
        vector< vector<int> > results;
	lm.BuildTaggingGraph(sent.words, sent.chars, sent.labels, results, cg, &dcorr, &dpredict, &doverall, false);
        dloss += as_scalar(cg.forward());
        for(int i = 0; i < results.size(); i ++){
                for(int j = 0; j < results[i].size(); j ++){
                        out << ld.Convert(results[i][j]) <<" ";
                }
                out<<"||| ";
        }
        out<<"\n";
        out.flush();
      }
	out.close();
      //lm.p_th2t->scale_parameters(1/pdrop);
      eval = false;
      double P = (dcorr / dpredict);
      double R = (dcorr / doverall);
      double F = 2*P*R / (P+R);
      cerr << "\n***DEV P = " << P << " R = " << R << " F=" << F << ' ';
}